

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.c
# Opt level: O0

int compressor_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  compressor_segment_data *data_00;
  float *parts;
  compressor_segment_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  data_00 = (compressor_segment_data *)segment->data;
  switch(field) {
  case 1:
    if ((*value & 1) == 0) {
      segment->mix = (_func_int_mixed_segment_ptr *)&LAB_001050e0;
    }
    else {
      segment->mix = compressor_segment_mix_bypass;
    }
    break;
  default:
    mixed_err(7);
    return 0;
  case 0x29:
    data_00->wet = *value;
    break;
  case 0x2c:
    data_00->pregain = *value;
    break;
  case 0x2d:
    data_00->threshold = *value;
    break;
  case 0x2e:
    data_00->knee = *value;
    break;
  case 0x2f:
    data_00->ratio = *value;
    break;
  case 0x30:
    data_00->attack = *value;
    break;
  case 0x31:
    data_00->release = *value;
    break;
  case 0x32:
    data_00->predelay = *value;
    break;
  case 0x33:
    data_00->releasezone[0] = *value;
    data_00->releasezone[1] = *(float *)((long)value + 4);
    data_00->releasezone[2] = *(float *)((long)value + 8);
    data_00->releasezone[3] = *(float *)((long)value + 0xc);
    break;
  case 0x34:
    data_00->postgain = *value;
  }
  compressor_reinit(data_00);
  return 1;
}

Assistant:

int compressor_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct compressor_segment_data *data = (struct compressor_segment_data *)segment->data;
  switch(field){
  case MIXED_BYPASS:
    if(*(bool *)value){
      segment->mix = compressor_segment_mix_bypass;
    }else{
      segment->mix = compressor_segment_mix;
    }
    break;
  case MIXED_COMPRESSOR_PREGAIN: data->pregain = *(float *)value; break;
  case MIXED_COMPRESSOR_THRESHOLD: data->threshold = *(float *)value; break;
  case MIXED_COMPRESSOR_KNEE: data->knee = *(float *)value; break;
  case MIXED_COMPRESSOR_RATIO: data->ratio = *(float *)value; break;
  case MIXED_COMPRESSOR_ATTACK: data->attack = *(float *)value; break;
  case MIXED_COMPRESSOR_RELEASE: data->release = *(float *)value; break;
  case MIXED_COMPRESSOR_PREDELAY: data->predelay = *(float *)value; break;
  case MIXED_COMPRESSOR_POSTGAIN: data->postgain = *(float *)value; break;
  case MIXED_MIX: data->wet = *(float *)value; break;
  case MIXED_COMPRESSOR_RELEASEZONE: {
    float *parts = (float *)value;
    data->releasezone[0] = parts[0];
    data->releasezone[1] = parts[1];
    data->releasezone[2] = parts[2];
    data->releasezone[3] = parts[3];
  } break;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  compressor_reinit(data);
  return 1;
}